

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Error asmjit::v1_14::Formatter::formatNodeList
                (String *sb,FormatOptions *formatOptions,BaseBuilder *builder,BaseNode *begin,
                BaseNode *end)

{
  Error EVar1;
  String *in_RCX;
  String *in_R8;
  Error _err_1;
  Error _err;
  BaseNode *node;
  BaseNode *in_stack_00000160;
  BaseBuilder *in_stack_00000168;
  FormatOptions *in_stack_00000170;
  String *in_stack_00000178;
  undefined4 in_stack_ffffffffffffffb0;
  char c;
  
  while( true ) {
    c = (char)((uint)in_stack_ffffffffffffffb0 >> 0x18);
    if (in_RCX == in_R8) {
      return 0;
    }
    EVar1 = formatNode(in_stack_00000178,in_stack_00000170,in_stack_00000168,in_stack_00000160);
    if (EVar1 != 0) break;
    EVar1 = String::_opChar(in_RCX,kAssign,c);
    if (EVar1 != 0) {
      return EVar1;
    }
    in_RCX = *(String **)(in_RCX + 8);
    in_stack_ffffffffffffffb0 = 0;
  }
  return EVar1;
}

Assistant:

Error formatNodeList(
  String& sb,
  const FormatOptions& formatOptions,
  const BaseBuilder* builder,
  const BaseNode* begin,
  const BaseNode* end) noexcept {

  const BaseNode* node = begin;
  while (node != end) {
    ASMJIT_PROPAGATE(formatNode(sb, formatOptions, builder, node));
    ASMJIT_PROPAGATE(sb.append('\n'));
    node = node->next();
  }
  return kErrorOk;
}